

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

string * __thiscall
llvm::ErrorInfoBase::message_abi_cxx11_(string *__return_storage_ptr__,ErrorInfoBase *this)

{
  pointer pcVar1;
  string Msg;
  raw_string_ostream OS;
  string local_68;
  raw_string_ostream local_48;
  
  local_48.OS = &local_68;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.super_raw_ostream.BufferMode = InternalBuffer;
  local_48.super_raw_ostream.OutBufStart = (char *)0x0;
  local_48.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_48.super_raw_ostream.OutBufCur = (char *)0x0;
  local_48.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001e8078;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  (*this->_vptr_ErrorInfoBase[2])(this,&local_48);
  if (local_48.super_raw_ostream.OutBufCur != local_48.super_raw_ostream.OutBufStart) {
    raw_ostream::flush_nonempty(&local_48.super_raw_ostream);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = ((local_48.OS)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (local_48.OS)->_M_string_length);
  raw_string_ostream::~raw_string_ostream(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string message() const {
    std::string Msg;
    raw_string_ostream OS(Msg);
    log(OS);
    return OS.str();
  }